

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::StructFilter::ToString
          (string *__return_storage_ptr__,StructFilter *this,string *column_name)

{
  pointer pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->child_name)._M_string_length == 0) {
    pTVar1 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator->(&this->child_filter);
    ::std::operator+(&local_48,"struct_extract_at(",column_name);
    ::std::operator+(&local_68,&local_48,",");
    ::std::__cxx11::to_string(&local_88,this->child_idx + 1);
    ::std::operator+(&local_a8,&local_68,&local_88);
    ::std::operator+(&bStack_c8,&local_a8,")");
    (*pTVar1->_vptr_TableFilter[3])(__return_storage_ptr__,pTVar1,&bStack_c8);
    ::std::__cxx11::string::~string((string *)&bStack_c8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_68);
    this_00 = &local_48;
  }
  else {
    pTVar1 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator->(&this->child_filter);
    ::std::operator+(&local_a8,column_name,".");
    ::std::operator+(&bStack_c8,&local_a8,&this->child_name);
    (*pTVar1->_vptr_TableFilter[3])(__return_storage_ptr__,pTVar1,&bStack_c8);
    ::std::__cxx11::string::~string((string *)&bStack_c8);
    this_00 = &local_a8;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string StructFilter::ToString(const string &column_name) const {
	if (!child_name.empty()) {
		return child_filter->ToString(column_name + "." + child_name);
	}
	return child_filter->ToString("struct_extract_at(" + column_name + "," + std::to_string(child_idx + 1) + ")");
}